

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::SetUses(LinearScan *this,Instr *instr,Opnd *opnd)

{
  Sym *this_00;
  Func *this_01;
  anon_class_16_2_f7f4a3d9 function;
  Opnd *pOVar1;
  OpndKind OVar2;
  bool bVar3;
  int size;
  SymOpnd *pSVar4;
  StackSym *this_02;
  IndirOpnd *this_03;
  RegOpnd *pRVar5;
  ListOpnd *this_04;
  IndirOpnd *indirOpnd;
  StackSym *stackSym;
  Sym *sym;
  Opnd *opnd_local;
  Instr *instr_local;
  LinearScan *this_local;
  
  opnd_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  OVar2 = IR::Opnd::GetKind(opnd);
  pOVar1 = opnd_local;
  switch(OVar2) {
  case OpndKindIntConst:
  case OpndKindAddr:
    LinearScanMD::LegalizeConstantUse(&this->linearScanMD,(Instr *)opnd_local,opnd);
    break;
  case OpndKindSym:
    pSVar4 = IR::Opnd::AsSymOpnd(opnd);
    this_00 = pSVar4->m_sym;
    bVar3 = Sym::IsStackSym(this_00);
    if (bVar3) {
      this_02 = Sym::AsStackSym(this_00);
      bVar3 = StackSym::IsAllocated(this_02);
      if (!bVar3) {
        this_01 = this->func;
        size = IR::Opnd::GetSize(opnd);
        Func::StackAllocate(this_01,this_02,size);
        if (this_02->scratch != (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
          *(ushort *)((long)this_02->scratch + 0x9c) =
               *(ushort *)((long)this_02->scratch + 0x9c) & 0xefff | 0x1000;
        }
      }
      LinearScanMD::LegalizeUse(&this->linearScanMD,(Instr *)opnd_local,opnd);
    }
    break;
  case OpndKindReg:
    pRVar5 = IR::Opnd::AsRegOpnd(opnd);
    SetUse(this,(Instr *)pOVar1,pRVar5);
    break;
  case OpndKindIndir:
    this_03 = IR::Opnd::AsIndirOpnd(opnd);
    pRVar5 = IR::IndirOpnd::GetBaseOpnd(this_03);
    pOVar1 = opnd_local;
    if (pRVar5 != (RegOpnd *)0x0) {
      pRVar5 = IR::IndirOpnd::GetBaseOpnd(this_03);
      SetUse(this,(Instr *)pOVar1,pRVar5);
    }
    pRVar5 = IR::IndirOpnd::GetIndexOpnd(this_03);
    pOVar1 = opnd_local;
    if (pRVar5 != (RegOpnd *)0x0) {
      pRVar5 = IR::IndirOpnd::GetIndexOpnd(this_03);
      SetUse(this,(Instr *)pOVar1,pRVar5);
    }
    break;
  case OpndKindList:
    this_04 = IR::Opnd::AsListOpnd(opnd);
    function.instr = (Instr **)&opnd_local;
    function.this = this;
    IR::ListOpnd::Map<LinearScan::SetUses(IR::Instr*,IR::Opnd*)::__0>(this_04,function);
  }
  return;
}

Assistant:

void
LinearScan::SetUses(IR::Instr *instr, IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        this->SetUse(instr, opnd->AsRegOpnd());
        break;

    case IR::OpndKindSym:
        {
            Sym * sym = opnd->AsSymOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                StackSym* stackSym = sym->AsStackSym();
                if (!stackSym->IsAllocated())
                {
                    func->StackAllocate(stackSym, opnd->GetSize());
                    // StackSym's lifetime is allocated during SCCLiveness::ProcessDst
                    // we might not need to set the flag if the sym is not a dst.
                    if (stackSym->scratch.linearScan.lifetime)
                    {
                        stackSym->scratch.linearScan.lifetime->cantStackPack = true;
                    }
                }
                this->linearScanMD.LegalizeUse(instr, opnd);
            }
        }
        break;
    case IR::OpndKindIndir:
        {
            IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();

            if (indirOpnd->GetBaseOpnd())
            {
                this->SetUse(instr, indirOpnd->GetBaseOpnd());
            }
            if (indirOpnd->GetIndexOpnd())
            {
                this->SetUse(instr, indirOpnd->GetIndexOpnd());
            }
        }
        break;

    case IR::OpndKindList:
    {
        opnd->AsListOpnd()->Map([&](int i, IR::Opnd* opnd)
        {
            this->SetUses(instr, opnd);
        });
    }
    break;

    case IR::OpndKindIntConst:
    case IR::OpndKindAddr:
        this->linearScanMD.LegalizeConstantUse(instr, opnd);
        break;
    };
}